

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

void __thiscall spvtools::opt::Function::ReorderBasicBlocksInStructuredOrder(Function *this)

{
  IRContext *this_00;
  _List_node_base *p_Var1;
  _List_iterator<spvtools::opt::BasicBlock_*> _Var2;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> order;
  _List_iterator<spvtools::opt::BasicBlock_*> local_30;
  _List_node_base *local_28;
  undefined8 local_20;
  
  local_20 = 0;
  this_00 = ((this->def_inst_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl)->context_;
  local_30._M_node = (_List_node_base *)&local_30;
  local_28 = (_List_node_base *)&local_30;
  if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(this_00);
  }
  CFG::ComputeStructuredOrder
            ((this_00->cfg_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
             _M_t.
             super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
             super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,this,
             (BasicBlock *)
             (((this->blocks_).
               super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t,(list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    *)&local_30);
  ReorderBasicBlocks<std::_List_iterator<spvtools::opt::BasicBlock*>>
            (this,local_30,(_List_node_base *)&local_30);
  _Var2._M_node = local_30._M_node;
  while (_Var2._M_node != (_List_node_base *)&local_30) {
    p_Var1 = (_Var2._M_node)->_M_next;
    operator_delete(_Var2._M_node,0x18);
    _Var2._M_node = p_Var1;
  }
  return;
}

Assistant:

void Function::ReorderBasicBlocksInStructuredOrder() {
  std::list<BasicBlock*> order;
  IRContext* context = this->def_inst_->context();
  context->cfg()->ComputeStructuredOrder(this, blocks_[0].get(), &order);
  ReorderBasicBlocks(order.begin(), order.end());
}